

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O2

bool __thiscall GF2::MI<8UL,_GF2::MOGrevlex<8UL>_>::IsGB(MI<8UL,_GF2::MOGrevlex<8UL>_> *this)

{
  _List_node_base **pp_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *pMVar4;
  const_reverse_iterator iter;
  _List_node_base *p_Var5;
  ulong i;
  _List_node_base **pp_Var6;
  MP<8UL,_GF2::MOGrevlex<8UL>_> poly;
  long local_58;
  _List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> local_50;
  
  local_50._M_impl._M_node._M_size = 0;
  local_58 = 0;
  p_Var5 = (_List_node_base *)this;
  local_50._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_50;
  local_50._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_50;
  while (p_Var2 = (this->
                  super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                  ).
                  super__List_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next, p_Var5 != p_Var2) {
    pp_Var1 = &p_Var5->_M_prev;
    for (i = 0; pp_Var6 = pp_Var1, i != 8; i = i + 1) {
      if (((ulong)(*pp_Var1)[1]._M_next[1]._M_next >> (i & 0x3f) & 1) != 0) {
        pMVar4 = MP<8UL,_GF2::MOGrevlex<8UL>_>::SPoly
                           ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)&local_50,i,
                            (MP<8UL,_GF2::MOGrevlex<8UL>_> *)(*pp_Var1 + 1));
        Reduce(this,pMVar4);
        if (local_50._M_impl._M_node._M_size != 0) goto LAB_00135612;
      }
    }
    while (p_Var3 = *pp_Var6,
          p_Var3 != (this->
                    super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                    ).
                    super__List_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next) {
      pp_Var6 = &p_Var3->_M_prev;
      if (((ulong)(*pp_Var1)[1]._M_next[1]._M_next & (ulong)p_Var3->_M_prev[1]._M_next[1]._M_next)
          != 0) {
        pMVar4 = MP<8UL,_GF2::MOGrevlex<8UL>_>::SPoly
                           ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)&local_50,
                            (MP<8UL,_GF2::MOGrevlex<8UL>_> *)(*pp_Var1 + 1),
                            (MP<8UL,_GF2::MOGrevlex<8UL>_> *)(p_Var3->_M_prev + 1));
        Reduce(this,pMVar4);
        if (local_50._M_impl._M_node._M_size != 0) goto LAB_00135612;
      }
    }
    local_58 = local_58 + 1;
    Env::Trace("IsGB: %zu polys",local_58);
    p_Var5 = *pp_Var1;
  }
LAB_00135612:
  std::__cxx11::_List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::_M_clear(&local_50);
  return p_Var5 == p_Var2;
}

Assistant:

bool IsGB() const
	{
		MP<_n, _O> poly(_order);
		// цикл по многочленам
		size_t trace = 0;
        for (const_reverse_iterator iter = rbegin(); iter != rend(); ++iter)
		{
			// цикл по парам (многочлен, уравнение поля)
			for (size_t i = 0; i < _n; i++)
				if (iter->LM().Test(i))
				{
					Reduce(poly.SPoly(i, *iter));
					if (poly != 0)
						return false;
				}
			// цикл по парам (многочлен, многочлен1)
			const_reverse_iterator iter1 = iter;
			for (++iter1; iter1 != rend(); ++iter1)
				if (!iter->LM().IsRelPrime(iter1->LM()))
				{
					Reduce(poly.SPoly(*iter, *iter1));
					if (poly != 0) 
						return false;
				}
			// трассировка
			Env::Trace("IsGB: %zu polys", ++trace);
		}
		return true;
	}